

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O1

int json_print_string(lyout *out,char *text)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  int iVar5;
  
  if (text == (char *)0x0) {
    iVar5 = 0;
  }
  else {
    ly_write(out,"\"",1);
    bVar1 = *text;
    if (bVar1 == 0) {
      iVar5 = 2;
    }
    else {
      uVar4 = 1;
      iVar5 = 0;
      pcVar3 = text;
      do {
        if (bVar1 < 0x20) {
          iVar2 = ly_print(out,"\\u%.4X");
        }
        else {
          if (bVar1 == 0x5c) {
            pcVar3 = "\\\\";
          }
          else {
            if (bVar1 != 0x22) {
              ly_write(out,pcVar3,1);
              iVar2 = 1;
              goto LAB_0019ca58;
            }
            pcVar3 = "\\\"";
          }
          iVar2 = ly_print(out,pcVar3);
        }
LAB_0019ca58:
        iVar5 = iVar5 + iVar2;
        pcVar3 = text + uVar4;
        bVar1 = text[uVar4];
        uVar4 = (ulong)((int)uVar4 + 1);
      } while (bVar1 != 0);
      iVar5 = iVar5 + 2;
    }
    ly_write(out,"\"",1);
  }
  return iVar5;
}

Assistant:

int
json_print_string(struct lyout *out, const char *text)
{
    unsigned int i, n;

    if (!text) {
        return 0;
    }

    ly_write(out, "\"", 1);
    for (i = n = 0; text[i]; i++) {
        const unsigned char ascii = text[i];
        if (ascii < 0x20) {
            /* control character */
            n += ly_print(out, "\\u%.4X", ascii);
        } else {
            switch (ascii) {
            case '"':
                n += ly_print(out, "\\\"");
                break;
            case '\\':
                n += ly_print(out, "\\\\");
                break;
            default:
                ly_write(out, &text[i], 1);
                n++;
            }
        }
    }
    ly_write(out, "\"", 1);

    return n + 2;
}